

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDFace::SharpEdgeCount(ON_SubDFace *this,ON_SubDEdgeSharpness *sharpness_range)

{
  bool bVar1;
  float in_RAX [2];
  uint uVar2;
  ON_SubDEdge *this_00;
  ON_SubDEdgePtr *pOVar3;
  ushort uVar4;
  ON_SubDEdgeSharpness OVar5;
  ON_SubDEdgeSharpness s;
  ON_SubDEdgeSharpness local_38;
  
  *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = (ON_SubDEdgeSharpness)0x0;
  if (this->m_edge_count == 0) {
    uVar2 = 0;
  }
  else {
    pOVar3 = this->m_edge4;
    uVar2 = 0;
    uVar4 = 0;
    local_38.m_edge_sharpness = in_RAX;
    do {
      if ((uVar4 == 4) && (pOVar3 = this->m_edgex, pOVar3 == (ON_SubDEdgePtr *)0x0)) {
        return uVar2;
      }
      this_00 = (ON_SubDEdge *)(pOVar3->m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) && (bVar1 = ON_SubDEdge::IsSharp(this_00), bVar1)) {
        local_38 = ON_SubDEdge::Sharpness(this_00,false);
        OVar5 = ON_SubDEdgeSharpness::Union(sharpness_range,&local_38);
        *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = OVar5;
        uVar2 = uVar2 + 1;
      }
      uVar4 = uVar4 + 1;
      pOVar3 = pOVar3 + 1;
    } while (uVar4 < this->m_edge_count);
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDFace::SharpEdgeCount(ON_SubDEdgeSharpness& sharpness_range) const
{
  sharpness_range = ON_SubDEdgeSharpness::Smooth;
  unsigned int sharp_edge_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr == e || false == e->IsSharp())
      continue;
    const ON_SubDEdgeSharpness s = e->Sharpness(false);
    sharpness_range = ON_SubDEdgeSharpness::Union(sharpness_range, s);
    ++sharp_edge_count;
  }
  return sharp_edge_count;
}